

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O0

string * formatFloatNumber(string *__return_storage_ptr__,string *number)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  string local_90;
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int local_5c;
  iterator iStack_58;
  int i;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  uint local_48;
  int zeroPostfix;
  string local_38;
  string *local_18;
  string *number_local;
  
  local_18 = number;
  number_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38,number);
  bVar1 = contain(&local_38,'.');
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
    local_48 = 0;
    local_50._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(number);
    iStack_58 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (number);
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )iStack_58._M_current);
    local_5c = 0;
    while (((uVar2 = (ulong)local_5c,
            sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(number), uVar2 < sVar3 - 1 &&
            (pvVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (number,(long)local_5c), *pvVar4 == '0')) &&
           (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](number,(long)(local_5c + 1)), *pvVar4 != '.'))) {
      local_48 = local_48 + 1;
      local_5c = local_5c + 1;
    }
    local_68._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(number);
    local_70 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 (number);
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (local_68,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_70);
    std::__cxx11::string::string((string *)&local_90,number);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (number);
    sliceString(__return_storage_ptr__,&local_90,0,~local_48 + (int)sVar3);
    std::__cxx11::string::~string((string *)&local_90);
    return __return_storage_ptr__;
  }
  __assert_fail("contain(number, \'.\')",
                "/workspace/llm4binary/github/license_all_cmakelists_25/egor-baranov[P]Neko/helpers.hpp"
                ,0x12d,"string formatFloatNumber(string)");
}

Assistant:

string formatFloatNumber(string number) {
	assert(contain(number, '.'));
	int zeroPostfix = 0;
	reverse(number.begin(), number.end());
	for (int i = 0; i < number.size() - 1; ++i) {
		if (number[i] == '0' and number[i + 1] != '.') {
			++zeroPostfix;
		} else break;
	}
	reverse(number.begin(), number.end());
	return sliceString(number, 0, number.size() - zeroPostfix - 1);
}